

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scenegraph.cpp
# Opt level: O2

Ref<embree::SceneGraph::Node> __thiscall
embree::SceneGraph::flatten
          (SceneGraph *this,Ref<embree::SceneGraph::Node> *node,InstancingMode mode)

{
  Ref<embree::SceneGraph::Node> local_80;
  SceneGraphFlattener local_78;
  
  local_80 = (Ref<embree::SceneGraph::Node>)node->ptr;
  if (local_80.ptr != (Node *)0x0) {
    (*((local_80.ptr)->super_RefCount)._vptr_RefCount[2])();
  }
  SceneGraphFlattener::SceneGraphFlattener(&local_78,&local_80,mode);
  *(Node **)this = local_78.node.ptr;
  local_78.node.ptr = (Node *)0x0;
  SceneGraphFlattener::~SceneGraphFlattener(&local_78);
  if (local_80.ptr != (Node *)0x0) {
    (*((local_80.ptr)->super_RefCount)._vptr_RefCount[3])();
  }
  return (Ref<embree::SceneGraph::Node>)(Node *)this;
}

Assistant:

Ref<SceneGraph::Node> SceneGraph::flatten(Ref<Node> node, InstancingMode mode) {
    return SceneGraphFlattener(node,mode).node;
  }